

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend-c-api.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__s;
  uint uVar1;
  int iVar2;
  int iVar3;
  qpdf_data p_Var4;
  char *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  qpdf_data in_stack_ffffffffffffffc8;
  int npages;
  qpdf_data qpdf;
  
  p_Var4 = (qpdf_data)qpdf_init();
  __s = *argv;
  qpdf = p_Var4;
  pcVar5 = strrchr(__s,0x2f);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strrchr(__s,0x5c);
    whoami = pcVar5 + 1;
    if (pcVar5 == (char *)0x0) {
      whoami = __s;
    }
  }
  else {
    whoami = pcVar5 + 1;
  }
  if (argc == 2) {
    uVar6 = qpdf_read(p_Var4,argv[1],0);
    if ((uVar6 & 2) == 0) {
      uVar1 = num_pages(in_stack_ffffffffffffffc8,(int *)0x1026d1);
      if ((uVar1 & 2) == 0) {
        printf("num pages = %d\n",(ulong)(uint)npages);
      }
    }
    iVar2 = qpdf_more_warnings(p_Var4);
    iVar3 = qpdf_has_error(p_Var4);
    if (iVar3 == 0) {
      qpdf_cleanup(&qpdf);
      iVar2 = (uint)(iVar2 != 0) * 3;
    }
    else {
      uVar7 = qpdf_get_error(p_Var4);
      uVar7 = qpdf_get_error_full_text(p_Var4,uVar7);
      printf("error: %s\n",uVar7);
      qpdf_cleanup(&qpdf);
      iVar2 = 2;
    }
    return iVar2;
  }
  fprintf(_stderr,"Usage: %s infile\n",whoami);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    char* infile = NULL;
    qpdf_data qpdf = qpdf_init();
    int warnings = 0;
    int errors = 0;
    char* p = NULL;

    if ((p = strrchr(argv[0], '/')) != NULL) {
        whoami = p + 1;
    } else if ((p = strrchr(argv[0], '\\')) != NULL) {
        whoami = p + 1;
    } else {
        whoami = argv[0];
    }

    if (argc != 2) {
        usage();
    }

    infile = argv[1];

    if ((qpdf_read(qpdf, infile, NULL) & QPDF_ERRORS) == 0) {
        int npages;
        if ((num_pages(qpdf, &npages) & QPDF_ERRORS) == 0) {
            printf("num pages = %d\n", npages);
        }
    }
    if (qpdf_more_warnings(qpdf)) {
        warnings = 1;
    }
    if (qpdf_has_error(qpdf)) {
        errors = 1;
        printf("error: %s\n", qpdf_get_error_full_text(qpdf, qpdf_get_error(qpdf)));
    }
    qpdf_cleanup(&qpdf);
    if (errors) {
        return 2;
    } else if (warnings) {
        return 3;
    }

    return 0;
}